

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::VertexIDCase::iterate(VertexIDCase *this)

{
  undefined8 *puVar1;
  int iVar2;
  int width;
  int height;
  TestLog *pTVar3;
  pointer pVVar4;
  RenderContext *pRVar5;
  Vec4 *pVVar6;
  undefined8 uVar7;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last_00;
  bool bVar8;
  int iVar9;
  uint uVar10;
  deUint32 dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  VertexIDCase *pVVar19;
  pointer pcVar20;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ScopedLogSection logSection;
  Surface refImg;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> mappedPos;
  ScopedLogSection logSection_1;
  Surface testImg;
  Vec4 clearColor;
  Random rnd;
  string local_f8;
  TextureFormat local_d8;
  uint local_d0;
  uint local_cc;
  undefined1 local_c8 [40];
  Surface local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long local_78;
  ScopedLogSection local_70;
  Surface local_68;
  Vec4 local_50;
  deRandom local_40;
  long lVar14;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar9);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = pRVar15->m_width;
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar15->m_height;
  width = this->m_viewportW;
  height = this->m_viewportH;
  uVar10 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar10 = (uVar10 >> 4 ^ uVar10) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar10 >> 0xf ^ uVar10 ^ 0xcf23ab1);
  tcu::Surface::Surface(&local_a0,width,height);
  tcu::Surface::Surface(&local_68,width,height);
  dVar11 = deRandom_getUint32(&local_40);
  local_cc = dVar11 % ((iVar9 - width) + 1U);
  dVar11 = deRandom_getUint32(&local_40);
  local_d0 = dVar11 % ((iVar2 - height) + 1U);
  uVar12 = (**(code **)(lVar14 + 0x780))((this->m_program->m_program).m_program,"a_position");
  uVar13 = (**(code **)(lVar14 + 0xb48))((this->m_program->m_program).m_program,"u_colors[0]");
  local_50.m_data[0] = (float)0;
  local_50.m_data[1] = (float)0;
  local_50.m_data[2] = (float)0;
  local_50.m_data[3] = (float)0x3f800000;
  (**(code **)(lVar14 + 0x1a00))(local_cc,local_d0,width,height);
  (**(code **)(lVar14 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar14 + 0x40))(0x8892,this->m_positionBuffer);
  (**(code **)(lVar14 + 0x610))(uVar12);
  (**(code **)(lVar14 + 0x19f0))(uVar12,4,0x1406,0,0,0);
  (**(code **)(lVar14 + 0x15a8))
            (uVar13,(ulong)((long)(this->m_colors).
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_colors).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  (**(code **)(lVar14 + 0x1c0))
            (local_50.m_data[0],local_50.m_data[1],local_50.m_data[2],local_50.m_data[3]);
  (**(code **)(lVar14 + 0x188))(0x4000);
  local_f8._M_dataplus._M_p = (pointer)0x300000008;
  pcVar20 = (pointer)local_a0.m_pixels.m_cap;
  if ((pointer)local_a0.m_pixels.m_cap != (pointer)0x0) {
    pcVar20 = (pointer)local_a0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_c8,(TextureFormat *)&local_f8,local_a0.m_width,
             local_a0.m_height,1,pcVar20);
  tcu::clear((PixelBufferAccess *)local_c8,&local_50);
  iVar9 = this->m_iterNdx;
  if (iVar9 == 2) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_c8._0_8_ = (long)local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Iter2","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"glDrawElements(), indices in buffer","");
    tcu::ScopedLogSection::ScopedLogSection(&local_70,pTVar3,(string *)local_c8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_f8,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_c8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_88,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_c8);
    last_00._M_current._4_4_ = local_f8._M_string_length._4_4_;
    last_00._M_current._0_4_ = (int)local_f8._M_string_length;
    uVar10 = (uint)((ulong)((long)last_00._M_current - (long)local_f8._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar10) {
      uVar17 = 0;
      do {
        *(unsigned_short *)((long)local_f8._M_dataplus._M_p + uVar17 * 2) = (unsigned_short)uVar17;
        uVar17 = uVar17 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar17);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)&local_40,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )local_f8._M_dataplus._M_p,last_00);
    if (0 < (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) -
                         (long)local_f8._M_dataplus._M_p) >> 1)) {
      lVar16 = 0;
      lVar18 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_positions).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
        uVar7 = puVar1[1];
        pVVar6 = (Vec4 *)(local_88._M_allocated_capacity +
                         (ulong)*(ushort *)(local_f8._M_dataplus._M_p + lVar18 * 2) * 0x10);
        *(undefined8 *)pVVar6->m_data = *puVar1;
        *(undefined8 *)(pVVar6->m_data + 2) = uVar7;
        lVar18 = lVar18 + 1;
        lVar16 = lVar16 + 0x10;
      } while (lVar18 < (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,
                                               (int)local_f8._M_string_length) -
                                     (long)local_f8._M_dataplus._M_p) >> 1));
    }
    (**(code **)(lVar14 + 0x40))(0x8893,this->m_elementBuffer);
    (**(code **)(lVar14 + 0x150))
              (0x8893,(long)((int)local_f8._M_string_length - (int)local_f8._M_dataplus._M_p) &
                      0xfffffffffffffffe,local_f8._M_dataplus._M_p,0x88e8);
    (**(code **)(lVar14 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                            *(int *)&(this->m_positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
               ,local_88._M_allocated_capacity,0x88e8);
    (**(code **)(lVar14 + 0x568))
              (4,(ulong)(CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) -
                        (long)local_f8._M_dataplus._M_p) >> 1,0x1403,0);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_d8.order = RGBA;
    local_d8.type = UNORM_INT8;
    if ((Context *)local_68.m_pixels.m_cap != (Context *)0x0) {
      local_68.m_pixels.m_cap = (size_t)local_68.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_c8,&local_d8,local_68.m_width,local_68.m_height,1,
               (void *)local_68.m_pixels.m_cap);
    glu::readPixels(pRVar5,local_cc,local_d0,(PixelBufferAccess *)local_c8);
    dVar11 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x423);
    local_d8.order = RGBA;
    local_d8.type = UNORM_INT8;
    pcVar20 = (pointer)local_a0.m_pixels.m_cap;
    if ((pointer)local_a0.m_pixels.m_cap != (pointer)0x0) {
      pcVar20 = (pointer)local_a0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_c8,&local_d8,local_a0.m_width,local_a0.m_height,1,pcVar20)
    ;
    tcu::clear((PixelBufferAccess *)local_c8,&local_50);
    local_d8.order = RGBA;
    local_d8.type = UNORM_INT8;
    if ((pointer)local_a0.m_pixels.m_cap != (pointer)0x0) {
      local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
    }
    pVVar19 = (VertexIDCase *)local_c8;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar19,&local_d8,local_a0.m_width,local_a0.m_height,1,
               (void *)local_a0.m_pixels.m_cap);
    renderReference(pVVar19,(PixelBufferAccess *)local_c8,
                    (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,
                                           (int)local_f8._M_string_length) -
                                 (long)local_f8._M_dataplus._M_p) >> 1),
                    (deUint16 *)local_f8._M_dataplus._M_p,(Vec4 *)local_88._M_allocated_capacity,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((Vec4 *)local_88._M_allocated_capacity != (Vec4 *)0x0) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78 - local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f8._M_dataplus._M_p,
                      local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
    }
    tcu::TestLog::endSection(local_70.m_log);
  }
  else if (iVar9 == 1) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_c8._0_8_ = (long)local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Iter1","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"glDrawElements(), indices in client-side array","");
    tcu::ScopedLogSection::ScopedLogSection(&local_70,pTVar3,(string *)local_c8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_f8,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_c8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_88,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_c8);
    last._M_current._4_4_ = local_f8._M_string_length._4_4_;
    last._M_current._0_4_ = (int)local_f8._M_string_length;
    uVar10 = (uint)((ulong)((long)last._M_current - (long)local_f8._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar10) {
      uVar17 = 0;
      do {
        *(unsigned_short *)((long)local_f8._M_dataplus._M_p + uVar17 * 2) = (unsigned_short)uVar17;
        uVar17 = uVar17 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar17);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)&local_40,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )local_f8._M_dataplus._M_p,last);
    if (0 < (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) -
                         (long)local_f8._M_dataplus._M_p) >> 1)) {
      lVar16 = 0;
      lVar18 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_positions).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16);
        uVar7 = puVar1[1];
        pVVar6 = (Vec4 *)(local_88._M_allocated_capacity +
                         (ulong)*(ushort *)(local_f8._M_dataplus._M_p + lVar18 * 2) * 0x10);
        *(undefined8 *)pVVar6->m_data = *puVar1;
        *(undefined8 *)(pVVar6->m_data + 2) = uVar7;
        lVar18 = lVar18 + 1;
        lVar16 = lVar16 + 0x10;
      } while (lVar18 < (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,
                                               (int)local_f8._M_string_length) -
                                     (long)local_f8._M_dataplus._M_p) >> 1));
    }
    (**(code **)(lVar14 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                            *(int *)&(this->m_positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
               ,local_88._M_allocated_capacity,0x88e8);
    (**(code **)(lVar14 + 0x568))
              (4,(ulong)(CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length) -
                        (long)local_f8._M_dataplus._M_p) >> 1,0x1403);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_d8.order = RGBA;
    local_d8.type = UNORM_INT8;
    if ((Context *)local_68.m_pixels.m_cap != (Context *)0x0) {
      local_68.m_pixels.m_cap = (size_t)local_68.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_c8,&local_d8,local_68.m_width,local_68.m_height,1,
               (void *)local_68.m_pixels.m_cap);
    glu::readPixels(pRVar5,local_cc,local_d0,(PixelBufferAccess *)local_c8);
    dVar11 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x409);
    local_d8.order = RGBA;
    local_d8.type = UNORM_INT8;
    if ((pointer)local_a0.m_pixels.m_cap != (pointer)0x0) {
      local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
    }
    pVVar19 = (VertexIDCase *)local_c8;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar19,&local_d8,local_a0.m_width,local_a0.m_height,1,
               (void *)local_a0.m_pixels.m_cap);
    renderReference(pVVar19,(PixelBufferAccess *)local_c8,
                    (int)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,
                                           (int)local_f8._M_string_length) -
                                 (long)local_f8._M_dataplus._M_p) >> 1),
                    (deUint16 *)local_f8._M_dataplus._M_p,(Vec4 *)local_88._M_allocated_capacity,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((Vec4 *)local_88._M_allocated_capacity != (Vec4 *)0x0) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78 - local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f8._M_dataplus._M_p,
                      local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
    }
    tcu::TestLog::endSection(local_70.m_log);
  }
  else if (iVar9 == 0) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_c8._0_8_ = (long)local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Iter0","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"glDrawArrays()","");
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_d8,pTVar3,(string *)local_c8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._0_8_ != (long)local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_f8,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_c8);
    pVVar4 = (this->m_positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar14 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar4) &
                      0xfffffffffffffff0,pVVar4,0x88e8);
    (**(code **)(lVar14 + 0x538))
              (4,0,(ulong)((long)(this->m_positions).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_positions).
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_88._M_allocated_capacity = 0x300000008;
    if ((Context *)local_68.m_pixels.m_cap != (Context *)0x0) {
      local_68.m_pixels.m_cap = (size_t)local_68.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_c8,(TextureFormat *)&local_88._M_allocated_capacity,
               local_68.m_width,local_68.m_height,1,(void *)local_68.m_pixels.m_cap);
    glu::readPixels(pRVar5,local_cc,local_d0,(PixelBufferAccess *)local_c8);
    dVar11 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar11,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x3ee);
    uVar10 = (uint)((ulong)(CONCAT44(local_f8._M_string_length._4_4_,(int)local_f8._M_string_length)
                           - (long)local_f8._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar10) {
      uVar17 = 0;
      do {
        *(short *)(local_f8._M_dataplus._M_p + uVar17 * 2) = (short)uVar17;
        uVar17 = uVar17 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar17);
    }
    local_88._M_allocated_capacity = 0x300000008;
    if ((pointer)local_a0.m_pixels.m_cap != (pointer)0x0) {
      local_a0.m_pixels.m_cap = (size_t)local_a0.m_pixels.m_ptr;
    }
    pVVar19 = (VertexIDCase *)local_c8;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar19,(TextureFormat *)&local_88._M_allocated_capacity,
               local_a0.m_width,local_a0.m_height,1,(void *)local_a0.m_pixels.m_cap);
    pVVar6 = (this->m_positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    renderReference(pVVar19,(PixelBufferAccess *)local_c8,
                    (int)((ulong)((long)(this->m_positions).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6)
                         >> 4),(deUint16 *)local_f8._M_dataplus._M_p,pVVar6,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f8._M_dataplus._M_p,
                      local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
    }
    tcu::TestLog::endSection((TestLog *)local_d8);
  }
  bVar8 = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            "Result","Image comparison result",&local_a0,&local_68,0.02,
                            COMPARE_LOG_RESULT);
  if (!bVar8) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  iVar9 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar9;
  tcu::Surface::~Surface(&local_68);
  tcu::Surface::~Surface(&local_a0);
  return (IterateResult)(iVar9 < 3);
}

Assistant:

VertexIDCase::IterateResult VertexIDCase::iterate (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();
	const int				viewportW	= m_viewportW;
	const int				viewportH	= m_viewportH;

	const float				threshold	= 0.02f;

	de::Random				rnd			(0xcf23ab1 ^ deInt32Hash(m_iterNdx));
	tcu::Surface			refImg		(viewportW, viewportH);
	tcu::Surface			testImg		(viewportW, viewportH);

	const int				viewportX	= rnd.getInt(0, width-viewportW);
	const int				viewportY	= rnd.getInt(0, height-viewportH);

	const int				posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				colorsLoc	= gl.getUniformLocation(m_program->getProgram(), "u_colors[0]");
	const tcu::Vec4			clearColor	(0.0f, 0.0f, 0.0f, 1.0f);

	// Setup common state.
	gl.viewport					(viewportX, viewportY, viewportW, viewportH);
	gl.useProgram				(m_program->getProgram());
	gl.bindBuffer				(GL_ARRAY_BUFFER, m_positionBuffer);
	gl.enableVertexAttribArray	(posLoc);
	gl.vertexAttribPointer		(posLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.uniform4fv				(colorsLoc, (int)m_colors.size(), (const float*)&m_colors[0]);

	// Clear render target to black.
	gl.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear		(GL_COLOR_BUFFER_BIT);

	tcu::clear(refImg.getAccess(), clearColor);

	if (m_iterNdx == 0)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter0", "glDrawArrays()");
		vector<deUint16>		indices		(m_positions.size());

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &m_positions[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, (int)m_positions.size());

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		// Reference indices
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;

		renderReference(refImg.getAccess(), (int)m_positions.size(), &indices[0], &m_positions[0], &m_colors[0]);
	}
	else if (m_iterNdx == 1)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter1", "glDrawElements(), indices in client-side array");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, &indices[0]);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else if (m_iterNdx == 2)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter2", "glDrawElements(), indices in buffer");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size()*sizeof(deUint16)), &indices[0], GL_DYNAMIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, DE_NULL);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		tcu::clear(refImg.getAccess(), clearColor);
		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else
		DE_ASSERT(false);

	if (!tcu::fuzzyCompare(m_testCtx.getLog(), "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_iterNdx += 1;
	return (m_iterNdx < 3) ? CONTINUE : STOP;
}